

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

bool __thiscall MP1Node::joinRepHandler(MP1Node *this,void *env,char *data,int size)

{
  char cVar1;
  bool bVar2;
  void *env_00;
  char *in_R8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"start joinRepHandler...",0x17);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  env_00 = (void *)(ulong)(uint)(int)cVar1;
  std::ostream::put('0');
  std::ostream::flush();
  if ((5 < size) && (bVar2 = recvMembershipList(this,env_00,data + 6,size + -6,in_R8), bVar2)) {
    this->memberNode->inGroup = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"...end joinRepHandler.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    return true;
  }
  return false;
}

Assistant:

bool MP1Node::joinRepHandler(void *env, char *data, int size) {
    cout << "start joinRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(replierAddr.addr, data, sizeof(memberNode->addr.addr));          //extract replier's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    if (!recvMembershipList(env, data, size, "JOINREP")) {
        return false;
    }
    this->memberNode->inGroup = true;

    cout << "...end joinRepHandler." << endl;
    return true;
}